

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftPvec(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  undefined4 *puVar1;
  pointer pnVar2;
  pointer pnVar3;
  Real RVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar10;
  long lVar11;
  long lVar12;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  uint *puVar15;
  undefined4 *puVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  undefined4 *puVar19;
  long lVar20;
  bool bVar21;
  byte bVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  DataKey local_6c8;
  uint auStack_6c0 [25];
  undefined3 uStack_65b;
  int iStack_658;
  bool bStack_654;
  undefined8 local_650;
  Random *local_640;
  cpp_dec_float<200U,_int,_void> local_638;
  cpp_dec_float<200U,_int,_void> local_5b8;
  cpp_dec_float<200U,_int,_void> local_538;
  cpp_dec_float<200U,_int,_void> local_4b8;
  cpp_dec_float<200U,_int,_void> local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar22 = 0;
  leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_438,this);
  local_338.fpclass = cpp_dec_float_finite;
  local_338.prec_elem = 0x1c;
  local_338.data._M_elems[0] = 0;
  local_338.data._M_elems[1] = 0;
  local_338.data._M_elems[2] = 0;
  local_338.data._M_elems[3] = 0;
  local_338.data._M_elems[4] = 0;
  local_338.data._M_elems[5] = 0;
  local_338.data._M_elems[6] = 0;
  local_338.data._M_elems[7] = 0;
  local_338.data._M_elems[8] = 0;
  local_338.data._M_elems[9] = 0;
  local_338.data._M_elems[10] = 0;
  local_338.data._M_elems[0xb] = 0;
  local_338.data._M_elems[0xc] = 0;
  local_338.data._M_elems[0xd] = 0;
  local_338.data._M_elems[0xe] = 0;
  local_338.data._M_elems[0xf] = 0;
  local_338.data._M_elems[0x10] = 0;
  local_338.data._M_elems[0x11] = 0;
  local_338.data._M_elems[0x12] = 0;
  local_338.data._M_elems[0x13] = 0;
  local_338.data._M_elems[0x14] = 0;
  local_338.data._M_elems[0x15] = 0;
  local_338.data._M_elems[0x16] = 0;
  local_338.data._M_elems[0x17] = 0;
  local_338.data._M_elems[0x18] = 0;
  local_338.data._M_elems[0x19] = 0;
  local_338.data._M_elems._104_5_ = 0;
  local_338.data._M_elems[0x1b]._1_3_ = 0;
  local_338.exp = 0;
  local_338.neg = false;
  local_650._0_4_ = cpp_dec_float_finite;
  local_650._4_4_ = 0x1c;
  local_6c8.info = 0;
  local_6c8.idx = 0;
  auStack_6c0[0] = 0;
  auStack_6c0[1] = 0;
  auStack_6c0[2] = 0;
  auStack_6c0[3] = 0;
  auStack_6c0[4] = 0;
  auStack_6c0[5] = 0;
  auStack_6c0[6] = 0;
  auStack_6c0[7] = 0;
  auStack_6c0[8] = 0;
  auStack_6c0[9] = 0;
  auStack_6c0[10] = 0;
  auStack_6c0[0xb] = 0;
  auStack_6c0[0xc] = 0;
  auStack_6c0[0xd] = 0;
  auStack_6c0[0xe] = 0;
  auStack_6c0[0xf] = 0;
  auStack_6c0[0x10] = 0;
  auStack_6c0[0x11] = 0;
  auStack_6c0[0x12] = 0;
  auStack_6c0[0x13] = 0;
  auStack_6c0[0x14] = 0;
  auStack_6c0[0x15] = 0;
  auStack_6c0[0x16] = 0;
  auStack_6c0[0x17] = 0;
  stack0xfffffffffffff9a0 = 0;
  uStack_65b = 0;
  iStack_658 = 0;
  bStack_654 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_6c8,10.0);
  pcVar14 = &local_438;
  pcVar17 = &local_338;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pcVar17->data)._M_elems[0] =
         (((cpp_dec_float<200U,_int,_void> *)&pcVar14->data)->data)._M_elems[0];
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar22 * -2 + 1) * 4);
    pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
  }
  local_338.exp = local_438.exp;
  local_338.neg = local_438.neg;
  local_338.fpclass = local_438.fpclass;
  local_338.prec_elem = local_438.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_338,(cpp_dec_float<200U,_int,_void> *)&local_6c8);
  leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_3b8,this);
  local_438.fpclass = cpp_dec_float_finite;
  local_438.prec_elem = 0x1c;
  local_438.data._M_elems[0] = 0;
  local_438.data._M_elems[1] = 0;
  local_438.data._M_elems[2] = 0;
  local_438.data._M_elems[3] = 0;
  local_438.data._M_elems[4] = 0;
  local_438.data._M_elems[5] = 0;
  local_438.data._M_elems[6] = 0;
  local_438.data._M_elems[7] = 0;
  local_438.data._M_elems[8] = 0;
  local_438.data._M_elems[9] = 0;
  local_438.data._M_elems[10] = 0;
  local_438.data._M_elems[0xb] = 0;
  local_438.data._M_elems[0xc] = 0;
  local_438.data._M_elems[0xd] = 0;
  local_438.data._M_elems[0xe] = 0;
  local_438.data._M_elems[0xf] = 0;
  local_438.data._M_elems[0x10] = 0;
  local_438.data._M_elems[0x11] = 0;
  local_438.data._M_elems[0x12] = 0;
  local_438.data._M_elems[0x13] = 0;
  local_438.data._M_elems[0x14] = 0;
  local_438.data._M_elems[0x15] = 0;
  local_438.data._M_elems[0x16] = 0;
  local_438.data._M_elems[0x17] = 0;
  local_438.data._M_elems[0x18] = 0;
  local_438.data._M_elems[0x19] = 0;
  local_438.data._M_elems._104_5_ = 0;
  local_438.data._M_elems[0x1b]._1_3_ = 0;
  local_438.exp = 0;
  local_438.neg = false;
  local_650._0_4_ = cpp_dec_float_finite;
  local_650._4_4_ = 0x1c;
  local_6c8.info = 0;
  local_6c8.idx = 0;
  auStack_6c0[0] = 0;
  auStack_6c0[1] = 0;
  auStack_6c0[2] = 0;
  auStack_6c0[3] = 0;
  auStack_6c0[4] = 0;
  auStack_6c0[5] = 0;
  auStack_6c0[6] = 0;
  auStack_6c0[7] = 0;
  auStack_6c0[8] = 0;
  auStack_6c0[9] = 0;
  auStack_6c0[10] = 0;
  auStack_6c0[0xb] = 0;
  auStack_6c0[0xc] = 0;
  auStack_6c0[0xd] = 0;
  auStack_6c0[0xe] = 0;
  auStack_6c0[0xf] = 0;
  auStack_6c0[0x10] = 0;
  auStack_6c0[0x11] = 0;
  auStack_6c0[0x12] = 0;
  auStack_6c0[0x13] = 0;
  auStack_6c0[0x14] = 0;
  auStack_6c0[0x15] = 0;
  auStack_6c0[0x16] = 0;
  auStack_6c0[0x17] = 0;
  stack0xfffffffffffff9a0 = 0;
  uStack_65b = 0;
  iStack_658 = 0;
  bStack_654 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_6c8,100.0);
  pcVar14 = &local_3b8;
  pcVar17 = &local_438;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pcVar17->data)._M_elems[0] =
         (((cpp_dec_float<200U,_int,_void> *)&pcVar14->data)->data)._M_elems[0];
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar22 * -2 + 1) * 4);
    pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
  }
  local_438.exp = local_3b8.exp;
  local_438.neg = local_3b8.neg;
  local_438.fpclass = local_3b8.fpclass;
  local_438.prec_elem = local_3b8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_438,(cpp_dec_float<200U,_int,_void> *)&local_6c8);
  leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_6c8,this);
  RVar4 = Tolerances::epsilon((this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_b8,RVar4);
  local_3b8.fpclass = cpp_dec_float_finite;
  local_3b8.prec_elem = 0x1c;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  pcVar14 = (cpp_dec_float<200U,_int,_void> *)&local_6c8;
  pcVar17 = &local_3b8;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pcVar17->data)._M_elems[0] =
         (((cpp_dec_float<200U,_int,_void> *)&pcVar14->data)->data)._M_elems[0];
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)
              ((long)pcVar14 + (ulong)bVar22 * 0xfffffffffffffff8 + 4);
    pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
  }
  local_3b8.exp = iStack_658;
  local_3b8.neg = bStack_654;
  local_3b8.fpclass = (fpclass_type)local_650;
  local_3b8.prec_elem = local_650._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_3b8,&local_b8);
  lVar11 = (long)(this->thecovectors->set).thenum;
  if (0 < lVar11) {
    local_640 = &this->random;
    lVar20 = lVar11 << 7;
    do {
      local_6c8 = (DataKey)coId(this,(int)(lVar11 + -1));
      bVar7 = isBasic(this,(SPxId *)&local_6c8);
      pnVar2 = (this->theCoUbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar20);
      local_650._0_4_ = cpp_dec_float_finite;
      local_650._4_4_ = 0x1c;
      local_6c8.info = 0;
      local_6c8.idx = 0;
      auStack_6c0[0] = 0;
      auStack_6c0[1] = 0;
      auStack_6c0[2] = 0;
      auStack_6c0[3] = 0;
      auStack_6c0[4] = 0;
      auStack_6c0[5] = 0;
      auStack_6c0[6] = 0;
      auStack_6c0[7] = 0;
      auStack_6c0[8] = 0;
      auStack_6c0[9] = 0;
      auStack_6c0[10] = 0;
      auStack_6c0[0xb] = 0;
      auStack_6c0[0xc] = 0;
      auStack_6c0[0xd] = 0;
      auStack_6c0[0xe] = 0;
      auStack_6c0[0xf] = 0;
      auStack_6c0[0x10] = 0;
      auStack_6c0[0x11] = 0;
      auStack_6c0[0x12] = 0;
      auStack_6c0[0x13] = 0;
      auStack_6c0[0x14] = 0;
      auStack_6c0[0x15] = 0;
      auStack_6c0[0x16] = 0;
      auStack_6c0[0x17] = 0;
      stack0xfffffffffffff9a0 = 0;
      uStack_65b = 0;
      iStack_658 = 0;
      bStack_654 = false;
      if (pcVar14 != (cpp_dec_float<200U,_int,_void> *)&local_6c8) {
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)&local_6c8;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        }
        iStack_658 = *(int *)((long)&(pnVar2->m_backend).data + lVar20 + -0x10);
        bStack_654 = *(bool *)((long)&(pnVar2->m_backend).data + lVar20 + -0xc);
        local_650 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar20 + -8);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                ((cpp_dec_float<200U,_int,_void> *)&local_6c8,&local_3b8);
      bVar21 = false;
      if (((fpclass_type)local_650 != cpp_dec_float_NaN) &&
         (pnVar2 = (this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, bVar21 = false,
         *(int *)((long)&pnVar2->m_backend + lVar20 + -8) != 2)) {
        iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)&local_6c8,
                           (cpp_dec_float<200U,_int,_void> *)
                           ((long)(pnVar2 + 0xffffffffffffffff) + lVar20));
        bVar21 = iVar8 < 1;
      }
      iVar8 = (int)lVar11;
      if ((bool)(bVar21 & !bVar7)) {
        pnVar2 = (this->theCoUbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((*(int *)((long)&(pnVar2->m_backend).data + lVar20 + -8) != 2) &&
           (pnVar3 = (this->theCoLbound->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           *(int *)((long)&(pnVar3->m_backend).data + lVar20 + -8) != 2)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)&pnVar2[-1].m_backend.data + lVar20),
                             (cpp_dec_float<200U,_int,_void> *)
                             ((long)&pnVar3[-1].m_backend.data + lVar20));
          if (iVar9 == 0) {
            pnVar2 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar15 = (uint *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20);
            pnVar18 = &local_138;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
            }
            local_138.m_backend.exp = *(int *)((long)&pnVar2->m_backend + lVar20 + -0x10);
            local_138.m_backend.neg = *(bool *)((long)&pnVar2->m_backend + lVar20 + -0xc);
            local_138.m_backend._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar20 + -8);
            shiftUCbound(this,iVar8 + -1,&local_138);
            pVVar10 = this->theCoUbound;
            pVVar13 = this->theCoLbound;
LAB_0052371a:
            pnVar2 = (pVVar10->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (undefined4 *)
                     ((long)&(pVVar13->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar20);
            puVar16 = (undefined4 *)((long)&pnVar2[-1].m_backend.data + lVar20);
            puVar19 = puVar1;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar19 = *puVar16;
              puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
              puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
            }
            puVar1[0x1c] = *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar20 + -0x10);
            *(undefined1 *)(puVar1 + 0x1d) =
                 *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar20 + -0xc);
            *(undefined8 *)(puVar1 + 0x1e) =
                 *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar20 + -8);
            goto LAB_0052374d;
          }
        }
        pnVar2 = (this->theCoPvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                          (&local_338);
        dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                          (&local_438);
        RVar4 = Random::next_random(local_640);
        local_4b8.fpclass = cpp_dec_float_finite;
        local_4b8.prec_elem = 0x1c;
        local_4b8.data._M_elems[0] = 0;
        local_4b8.data._M_elems[1] = 0;
        local_4b8.data._M_elems[2] = 0;
        local_4b8.data._M_elems[3] = 0;
        local_4b8.data._M_elems[4] = 0;
        local_4b8.data._M_elems[5] = 0;
        local_4b8.data._M_elems[6] = 0;
        local_4b8.data._M_elems[7] = 0;
        local_4b8.data._M_elems[8] = 0;
        local_4b8.data._M_elems[9] = 0;
        local_4b8.data._M_elems[10] = 0;
        local_4b8.data._M_elems[0xb] = 0;
        local_4b8.data._M_elems[0xc] = 0;
        local_4b8.data._M_elems[0xd] = 0;
        local_4b8.data._M_elems[0xe] = 0;
        local_4b8.data._M_elems[0xf] = 0;
        local_4b8.data._M_elems[0x10] = 0;
        local_4b8.data._M_elems[0x11] = 0;
        local_4b8.data._M_elems[0x12] = 0;
        local_4b8.data._M_elems[0x13] = 0;
        local_4b8.data._M_elems[0x14] = 0;
        local_4b8.data._M_elems[0x15] = 0;
        local_4b8.data._M_elems[0x16] = 0;
        local_4b8.data._M_elems[0x17] = 0;
        local_4b8.data._M_elems[0x18] = 0;
        local_4b8.data._M_elems[0x19] = 0;
        local_4b8.data._M_elems._104_5_ = 0;
        local_4b8.data._M_elems[0x1b]._1_3_ = 0;
        local_4b8.exp = 0;
        local_4b8.neg = false;
        local_650._0_4_ = cpp_dec_float_finite;
        local_650._4_4_ = 0x1c;
        local_6c8.info = 0;
        local_6c8.idx = 0;
        auStack_6c0[0] = 0;
        auStack_6c0[1] = 0;
        auStack_6c0[2] = 0;
        auStack_6c0[3] = 0;
        auStack_6c0[4] = 0;
        auStack_6c0[5] = 0;
        auStack_6c0[6] = 0;
        auStack_6c0[7] = 0;
        auStack_6c0[8] = 0;
        auStack_6c0[9] = 0;
        auStack_6c0[10] = 0;
        auStack_6c0[0xb] = 0;
        auStack_6c0[0xc] = 0;
        auStack_6c0[0xd] = 0;
        auStack_6c0[0xe] = 0;
        auStack_6c0[0xf] = 0;
        auStack_6c0[0x10] = 0;
        auStack_6c0[0x11] = 0;
        auStack_6c0[0x12] = 0;
        auStack_6c0[0x13] = 0;
        auStack_6c0[0x14] = 0;
        auStack_6c0[0x15] = 0;
        auStack_6c0[0x16] = 0;
        auStack_6c0[0x17] = 0;
        stack0xfffffffffffff9a0 = 0;
        uStack_65b = 0;
        iStack_658 = 0;
        bStack_654 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_6c8,RVar4 * dVar6 + (1.0 - RVar4) * dVar5)
        ;
        if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20) !=
            &local_4b8) {
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20)
          ;
          pcVar17 = &local_4b8;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          }
          local_4b8.exp = *(int *)((long)&pnVar2->m_backend + lVar20 + -0x10);
          local_4b8.neg = *(bool *)((long)&pnVar2->m_backend + lVar20 + -0xc);
          local_4b8._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar20 + -8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&local_4b8,(cpp_dec_float<200U,_int,_void> *)&local_6c8);
        shiftUCbound(this,iVar8 + -1,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_4b8);
      }
      else {
        pnVar2 = (this->theCoLbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar20);
        local_650._0_4_ = cpp_dec_float_finite;
        local_650._4_4_ = 0x1c;
        local_6c8.info = 0;
        local_6c8.idx = 0;
        auStack_6c0[0] = 0;
        auStack_6c0[1] = 0;
        auStack_6c0[2] = 0;
        auStack_6c0[3] = 0;
        auStack_6c0[4] = 0;
        auStack_6c0[5] = 0;
        auStack_6c0[6] = 0;
        auStack_6c0[7] = 0;
        auStack_6c0[8] = 0;
        auStack_6c0[9] = 0;
        auStack_6c0[10] = 0;
        auStack_6c0[0xb] = 0;
        auStack_6c0[0xc] = 0;
        auStack_6c0[0xd] = 0;
        auStack_6c0[0xe] = 0;
        auStack_6c0[0xf] = 0;
        auStack_6c0[0x10] = 0;
        auStack_6c0[0x11] = 0;
        auStack_6c0[0x12] = 0;
        auStack_6c0[0x13] = 0;
        auStack_6c0[0x14] = 0;
        auStack_6c0[0x15] = 0;
        auStack_6c0[0x16] = 0;
        auStack_6c0[0x17] = 0;
        stack0xfffffffffffff9a0 = 0;
        uStack_65b = 0;
        iStack_658 = 0;
        bStack_654 = false;
        if (pcVar14 != (cpp_dec_float<200U,_int,_void> *)&local_6c8) {
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)&local_6c8;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          }
          iStack_658 = *(int *)((long)&(pnVar2->m_backend).data + lVar20 + -0x10);
          bStack_654 = *(bool *)((long)&(pnVar2->m_backend).data + lVar20 + -0xc);
          local_650 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar20 + -8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)&local_6c8,&local_3b8);
        bVar21 = false;
        if (((fpclass_type)local_650 != cpp_dec_float_NaN) &&
           (pnVar2 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, bVar21 = false,
           *(int *)((long)&pnVar2->m_backend + lVar20 + -8) != 2)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&local_6c8,
                             (cpp_dec_float<200U,_int,_void> *)
                             ((long)(pnVar2 + 0xffffffffffffffff) + lVar20));
          bVar21 = -1 < iVar9;
        }
        if ((bool)(bVar21 & !bVar7)) {
          pnVar2 = (this->theCoUbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((*(int *)((long)&(pnVar2->m_backend).data + lVar20 + -8) != 2) &&
             (pnVar3 = (this->theCoLbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar3->m_backend).data + lVar20 + -8) != 2)) {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar2[-1].m_backend.data + lVar20),
                               (cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar3[-1].m_backend.data + lVar20));
            if (iVar9 == 0) {
              pnVar2 = (this->theCoPvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar15 = (uint *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20);
              pnVar18 = &local_1b8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar18->m_backend).data._M_elems[0] = *puVar15;
                puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
                pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
              }
              local_1b8.m_backend.exp = *(int *)((long)&pnVar2->m_backend + lVar20 + -0x10);
              local_1b8.m_backend.neg = *(bool *)((long)&pnVar2->m_backend + lVar20 + -0xc);
              local_1b8.m_backend._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar20 + -8);
              shiftLCbound(this,iVar8 + -1,&local_1b8);
              pVVar13 = this->theCoUbound;
              pVVar10 = this->theCoLbound;
              goto LAB_0052371a;
            }
          }
          pnVar2 = (this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_338);
          dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_438);
          RVar4 = Random::next_random(local_640);
          local_5b8.fpclass = cpp_dec_float_finite;
          local_5b8.prec_elem = 0x1c;
          local_5b8.data._M_elems[0] = 0;
          local_5b8.data._M_elems[1] = 0;
          local_5b8.data._M_elems[2] = 0;
          local_5b8.data._M_elems[3] = 0;
          local_5b8.data._M_elems[4] = 0;
          local_5b8.data._M_elems[5] = 0;
          local_5b8.data._M_elems[6] = 0;
          local_5b8.data._M_elems[7] = 0;
          local_5b8.data._M_elems[8] = 0;
          local_5b8.data._M_elems[9] = 0;
          local_5b8.data._M_elems[10] = 0;
          local_5b8.data._M_elems[0xb] = 0;
          local_5b8.data._M_elems[0xc] = 0;
          local_5b8.data._M_elems[0xd] = 0;
          local_5b8.data._M_elems[0xe] = 0;
          local_5b8.data._M_elems[0xf] = 0;
          local_5b8.data._M_elems[0x10] = 0;
          local_5b8.data._M_elems[0x11] = 0;
          local_5b8.data._M_elems[0x12] = 0;
          local_5b8.data._M_elems[0x13] = 0;
          local_5b8.data._M_elems[0x14] = 0;
          local_5b8.data._M_elems[0x15] = 0;
          local_5b8.data._M_elems[0x16] = 0;
          local_5b8.data._M_elems[0x17] = 0;
          local_5b8.data._M_elems[0x18] = 0;
          local_5b8.data._M_elems[0x19] = 0;
          local_5b8.data._M_elems._104_5_ = 0;
          local_5b8.data._M_elems[0x1b]._1_3_ = 0;
          local_5b8.exp = 0;
          local_5b8.neg = false;
          local_650._0_4_ = cpp_dec_float_finite;
          local_650._4_4_ = 0x1c;
          local_6c8.info = 0;
          local_6c8.idx = 0;
          auStack_6c0[0] = 0;
          auStack_6c0[1] = 0;
          auStack_6c0[2] = 0;
          auStack_6c0[3] = 0;
          auStack_6c0[4] = 0;
          auStack_6c0[5] = 0;
          auStack_6c0[6] = 0;
          auStack_6c0[7] = 0;
          auStack_6c0[8] = 0;
          auStack_6c0[9] = 0;
          auStack_6c0[10] = 0;
          auStack_6c0[0xb] = 0;
          auStack_6c0[0xc] = 0;
          auStack_6c0[0xd] = 0;
          auStack_6c0[0xe] = 0;
          auStack_6c0[0xf] = 0;
          auStack_6c0[0x10] = 0;
          auStack_6c0[0x11] = 0;
          auStack_6c0[0x12] = 0;
          auStack_6c0[0x13] = 0;
          auStack_6c0[0x14] = 0;
          auStack_6c0[0x15] = 0;
          auStack_6c0[0x16] = 0;
          auStack_6c0[0x17] = 0;
          stack0xfffffffffffff9a0 = 0;
          uStack_65b = 0;
          iStack_658 = 0;
          bStack_654 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_6c8,
                     RVar4 * dVar6 + (1.0 - RVar4) * dVar5);
          if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20) !=
              &local_5b8) {
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pnVar2 + 0xffffffffffffffff) + lVar20);
            pcVar17 = &local_5b8;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
            }
            local_5b8.exp = *(int *)((long)&pnVar2->m_backend + lVar20 + -0x10);
            local_5b8.neg = *(bool *)((long)&pnVar2->m_backend + lVar20 + -0xc);
            local_5b8._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar20 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_5b8,(cpp_dec_float<200U,_int,_void> *)&local_6c8);
          shiftLCbound(this,iVar8 + -1,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_5b8);
        }
      }
LAB_0052374d:
      lVar20 = lVar20 + -0x80;
      bVar7 = 1 < lVar11;
      lVar11 = lVar11 + -1;
    } while (bVar7);
  }
  lVar11 = (long)(this->thevectors->set).thenum;
  if (0 < lVar11) {
    lVar20 = lVar11 << 7;
    do {
      local_6c8 = (DataKey)id(this,(int)(lVar11 + -1));
      bVar7 = isBasic(this,(SPxId *)&local_6c8);
      pnVar2 = (this->theUbound->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar20);
      local_650._0_4_ = cpp_dec_float_finite;
      local_650._4_4_ = 0x1c;
      local_6c8.info = 0;
      local_6c8.idx = 0;
      auStack_6c0[0] = 0;
      auStack_6c0[1] = 0;
      auStack_6c0[2] = 0;
      auStack_6c0[3] = 0;
      auStack_6c0[4] = 0;
      auStack_6c0[5] = 0;
      auStack_6c0[6] = 0;
      auStack_6c0[7] = 0;
      auStack_6c0[8] = 0;
      auStack_6c0[9] = 0;
      auStack_6c0[10] = 0;
      auStack_6c0[0xb] = 0;
      auStack_6c0[0xc] = 0;
      auStack_6c0[0xd] = 0;
      auStack_6c0[0xe] = 0;
      auStack_6c0[0xf] = 0;
      auStack_6c0[0x10] = 0;
      auStack_6c0[0x11] = 0;
      auStack_6c0[0x12] = 0;
      auStack_6c0[0x13] = 0;
      auStack_6c0[0x14] = 0;
      auStack_6c0[0x15] = 0;
      auStack_6c0[0x16] = 0;
      auStack_6c0[0x17] = 0;
      stack0xfffffffffffff9a0 = 0;
      uStack_65b = 0;
      iStack_658 = 0;
      bStack_654 = false;
      if (pcVar14 != (cpp_dec_float<200U,_int,_void> *)&local_6c8) {
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)&local_6c8;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        }
        iStack_658 = *(int *)((long)&(pnVar2->m_backend).data + lVar20 + -0x10);
        bStack_654 = *(bool *)((long)&(pnVar2->m_backend).data + lVar20 + -0xc);
        local_650 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar20 + -8);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                ((cpp_dec_float<200U,_int,_void> *)&local_6c8,&local_3b8);
      bVar21 = false;
      if (((fpclass_type)local_650 != cpp_dec_float_NaN) &&
         (pnVar2 = (this->thePvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, bVar21 = false,
         *(int *)((long)&pnVar2->m_backend + lVar20 + -8) != 2)) {
        iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)&local_6c8,
                           (cpp_dec_float<200U,_int,_void> *)
                           ((long)(pnVar2 + 0xffffffffffffffff) + lVar20));
        bVar21 = iVar8 < 1;
      }
      iVar8 = (int)lVar11;
      if ((bool)(bVar21 & !bVar7)) {
        pnVar2 = (this->theUbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((*(int *)((long)&(pnVar2->m_backend).data + lVar20 + -8) != 2) &&
           (pnVar3 = (this->theLbound->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           *(int *)((long)&(pnVar3->m_backend).data + lVar20 + -8) != 2)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)&pnVar2[-1].m_backend.data + lVar20),
                             (cpp_dec_float<200U,_int,_void> *)
                             ((long)&pnVar3[-1].m_backend.data + lVar20));
          if (iVar9 == 0) {
            pnVar2 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar15 = (uint *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20);
            pnVar18 = &local_238;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
            }
            local_238.m_backend.exp = *(int *)((long)&pnVar2->m_backend + lVar20 + -0x10);
            local_238.m_backend.neg = *(bool *)((long)&pnVar2->m_backend + lVar20 + -0xc);
            local_238.m_backend._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar20 + -8);
            shiftUPbound(this,iVar8 + -1,&local_238);
            pVVar10 = this->theUbound;
            pVVar13 = this->theLbound;
LAB_00523d7e:
            pnVar2 = (pVVar10->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (undefined4 *)
                     ((long)&(pVVar13->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar20);
            puVar16 = (undefined4 *)((long)&pnVar2[-1].m_backend.data + lVar20);
            puVar19 = puVar1;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar19 = *puVar16;
              puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
              puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
            }
            puVar1[0x1c] = *(undefined4 *)((long)&(pnVar2->m_backend).data + lVar20 + -0x10);
            *(undefined1 *)(puVar1 + 0x1d) =
                 *(undefined1 *)((long)&(pnVar2->m_backend).data + lVar20 + -0xc);
            *(undefined8 *)(puVar1 + 0x1e) =
                 *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar20 + -8);
            goto LAB_00523db1;
          }
        }
        pnVar2 = (this->thePvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                          (&local_338);
        dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                          (&local_438);
        RVar4 = Random::next_random(&this->random);
        local_538.fpclass = cpp_dec_float_finite;
        local_538.prec_elem = 0x1c;
        local_538.data._M_elems[0] = 0;
        local_538.data._M_elems[1] = 0;
        local_538.data._M_elems[2] = 0;
        local_538.data._M_elems[3] = 0;
        local_538.data._M_elems[4] = 0;
        local_538.data._M_elems[5] = 0;
        local_538.data._M_elems[6] = 0;
        local_538.data._M_elems[7] = 0;
        local_538.data._M_elems[8] = 0;
        local_538.data._M_elems[9] = 0;
        local_538.data._M_elems[10] = 0;
        local_538.data._M_elems[0xb] = 0;
        local_538.data._M_elems[0xc] = 0;
        local_538.data._M_elems[0xd] = 0;
        local_538.data._M_elems[0xe] = 0;
        local_538.data._M_elems[0xf] = 0;
        local_538.data._M_elems[0x10] = 0;
        local_538.data._M_elems[0x11] = 0;
        local_538.data._M_elems[0x12] = 0;
        local_538.data._M_elems[0x13] = 0;
        local_538.data._M_elems[0x14] = 0;
        local_538.data._M_elems[0x15] = 0;
        local_538.data._M_elems[0x16] = 0;
        local_538.data._M_elems[0x17] = 0;
        local_538.data._M_elems[0x18] = 0;
        local_538.data._M_elems[0x19] = 0;
        local_538.data._M_elems._104_5_ = 0;
        local_538.data._M_elems[0x1b]._1_3_ = 0;
        local_538.exp = 0;
        local_538.neg = false;
        local_650._0_4_ = cpp_dec_float_finite;
        local_650._4_4_ = 0x1c;
        local_6c8.info = 0;
        local_6c8.idx = 0;
        auStack_6c0[0] = 0;
        auStack_6c0[1] = 0;
        auStack_6c0[2] = 0;
        auStack_6c0[3] = 0;
        auStack_6c0[4] = 0;
        auStack_6c0[5] = 0;
        auStack_6c0[6] = 0;
        auStack_6c0[7] = 0;
        auStack_6c0[8] = 0;
        auStack_6c0[9] = 0;
        auStack_6c0[10] = 0;
        auStack_6c0[0xb] = 0;
        auStack_6c0[0xc] = 0;
        auStack_6c0[0xd] = 0;
        auStack_6c0[0xe] = 0;
        auStack_6c0[0xf] = 0;
        auStack_6c0[0x10] = 0;
        auStack_6c0[0x11] = 0;
        auStack_6c0[0x12] = 0;
        auStack_6c0[0x13] = 0;
        auStack_6c0[0x14] = 0;
        auStack_6c0[0x15] = 0;
        auStack_6c0[0x16] = 0;
        auStack_6c0[0x17] = 0;
        stack0xfffffffffffff9a0 = 0;
        uStack_65b = 0;
        iStack_658 = 0;
        bStack_654 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_6c8,RVar4 * dVar6 + (1.0 - RVar4) * dVar5)
        ;
        if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20) !=
            &local_538) {
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20)
          ;
          pcVar17 = &local_538;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          }
          local_538.exp = *(int *)((long)&pnVar2->m_backend + lVar20 + -0x10);
          local_538.neg = *(bool *)((long)&pnVar2->m_backend + lVar20 + -0xc);
          local_538._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar20 + -8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&local_538,(cpp_dec_float<200U,_int,_void> *)&local_6c8);
        shiftUPbound(this,iVar8 + -1,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_538);
      }
      else {
        pnVar2 = (this->theLbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar20);
        local_650._0_4_ = cpp_dec_float_finite;
        local_650._4_4_ = 0x1c;
        local_6c8.info = 0;
        local_6c8.idx = 0;
        auStack_6c0[0] = 0;
        auStack_6c0[1] = 0;
        auStack_6c0[2] = 0;
        auStack_6c0[3] = 0;
        auStack_6c0[4] = 0;
        auStack_6c0[5] = 0;
        auStack_6c0[6] = 0;
        auStack_6c0[7] = 0;
        auStack_6c0[8] = 0;
        auStack_6c0[9] = 0;
        auStack_6c0[10] = 0;
        auStack_6c0[0xb] = 0;
        auStack_6c0[0xc] = 0;
        auStack_6c0[0xd] = 0;
        auStack_6c0[0xe] = 0;
        auStack_6c0[0xf] = 0;
        auStack_6c0[0x10] = 0;
        auStack_6c0[0x11] = 0;
        auStack_6c0[0x12] = 0;
        auStack_6c0[0x13] = 0;
        auStack_6c0[0x14] = 0;
        auStack_6c0[0x15] = 0;
        auStack_6c0[0x16] = 0;
        auStack_6c0[0x17] = 0;
        stack0xfffffffffffff9a0 = 0;
        uStack_65b = 0;
        iStack_658 = 0;
        bStack_654 = false;
        if (pcVar14 != (cpp_dec_float<200U,_int,_void> *)&local_6c8) {
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)&local_6c8;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
          }
          iStack_658 = *(int *)((long)&(pnVar2->m_backend).data + lVar20 + -0x10);
          bStack_654 = *(bool *)((long)&(pnVar2->m_backend).data + lVar20 + -0xc);
          local_650 = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar20 + -8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)&local_6c8,&local_3b8);
        bVar21 = false;
        if (((fpclass_type)local_650 != cpp_dec_float_NaN) &&
           (pnVar2 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, bVar21 = false,
           *(int *)((long)&pnVar2->m_backend + lVar20 + -8) != 2)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&local_6c8,
                             (cpp_dec_float<200U,_int,_void> *)
                             ((long)(pnVar2 + 0xffffffffffffffff) + lVar20));
          bVar21 = -1 < iVar9;
        }
        if ((bool)(bVar21 & !bVar7)) {
          pnVar2 = (this->theUbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((*(int *)((long)&(pnVar2->m_backend).data + lVar20 + -8) != 2) &&
             (pnVar3 = (this->theLbound->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&(pnVar3->m_backend).data + lVar20 + -8) != 2)) {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar2[-1].m_backend.data + lVar20),
                               (cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar3[-1].m_backend.data + lVar20));
            if (iVar9 == 0) {
              pnVar2 = (this->thePvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar15 = (uint *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20);
              pnVar18 = &local_2b8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar18->m_backend).data._M_elems[0] = *puVar15;
                puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
                pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
              }
              local_2b8.m_backend.exp = *(int *)((long)&pnVar2->m_backend + lVar20 + -0x10);
              local_2b8.m_backend.neg = *(bool *)((long)&pnVar2->m_backend + lVar20 + -0xc);
              local_2b8.m_backend._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar20 + -8);
              shiftLPbound(this,iVar8 + -1,&local_2b8);
              pVVar13 = this->theUbound;
              pVVar10 = this->theLbound;
              goto LAB_00523d7e;
            }
          }
          pnVar2 = (this->thePvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_338);
          dVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                            (&local_438);
          RVar4 = Random::next_random(&this->random);
          local_638.fpclass = cpp_dec_float_finite;
          local_638.prec_elem = 0x1c;
          local_638.data._M_elems[0] = 0;
          local_638.data._M_elems[1] = 0;
          local_638.data._M_elems[2] = 0;
          local_638.data._M_elems[3] = 0;
          local_638.data._M_elems[4] = 0;
          local_638.data._M_elems[5] = 0;
          local_638.data._M_elems[6] = 0;
          local_638.data._M_elems[7] = 0;
          local_638.data._M_elems[8] = 0;
          local_638.data._M_elems[9] = 0;
          local_638.data._M_elems[10] = 0;
          local_638.data._M_elems[0xb] = 0;
          local_638.data._M_elems[0xc] = 0;
          local_638.data._M_elems[0xd] = 0;
          local_638.data._M_elems[0xe] = 0;
          local_638.data._M_elems[0xf] = 0;
          local_638.data._M_elems[0x10] = 0;
          local_638.data._M_elems[0x11] = 0;
          local_638.data._M_elems[0x12] = 0;
          local_638.data._M_elems[0x13] = 0;
          local_638.data._M_elems[0x14] = 0;
          local_638.data._M_elems[0x15] = 0;
          local_638.data._M_elems[0x16] = 0;
          local_638.data._M_elems[0x17] = 0;
          local_638.data._M_elems[0x18] = 0;
          local_638.data._M_elems[0x19] = 0;
          local_638.data._M_elems._104_5_ = 0;
          local_638.data._M_elems[0x1b]._1_3_ = 0;
          local_638.exp = 0;
          local_638.neg = false;
          local_650._0_4_ = cpp_dec_float_finite;
          local_650._4_4_ = 0x1c;
          local_6c8.info = 0;
          local_6c8.idx = 0;
          auStack_6c0[0] = 0;
          auStack_6c0[1] = 0;
          auStack_6c0[2] = 0;
          auStack_6c0[3] = 0;
          auStack_6c0[4] = 0;
          auStack_6c0[5] = 0;
          auStack_6c0[6] = 0;
          auStack_6c0[7] = 0;
          auStack_6c0[8] = 0;
          auStack_6c0[9] = 0;
          auStack_6c0[10] = 0;
          auStack_6c0[0xb] = 0;
          auStack_6c0[0xc] = 0;
          auStack_6c0[0xd] = 0;
          auStack_6c0[0xe] = 0;
          auStack_6c0[0xf] = 0;
          auStack_6c0[0x10] = 0;
          auStack_6c0[0x11] = 0;
          auStack_6c0[0x12] = 0;
          auStack_6c0[0x13] = 0;
          auStack_6c0[0x14] = 0;
          auStack_6c0[0x15] = 0;
          auStack_6c0[0x16] = 0;
          auStack_6c0[0x17] = 0;
          stack0xfffffffffffff9a0 = 0;
          uStack_65b = 0;
          iStack_658 = 0;
          bStack_654 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_6c8,
                     RVar4 * dVar6 + (1.0 - RVar4) * dVar5);
          if ((cpp_dec_float<200U,_int,_void> *)((long)(pnVar2 + 0xffffffffffffffff) + lVar20) !=
              &local_638) {
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pnVar2 + 0xffffffffffffffff) + lVar20);
            pcVar17 = &local_638;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
            }
            local_638.exp = *(int *)((long)&pnVar2->m_backend + lVar20 + -0x10);
            local_638.neg = *(bool *)((long)&pnVar2->m_backend + lVar20 + -0xc);
            local_638._120_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar20 + -8);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_638,(cpp_dec_float<200U,_int,_void> *)&local_6c8);
          shiftLPbound(this,iVar8 + -1,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_638);
        }
      }
LAB_00523db1:
      lVar20 = lVar20 + -0x80;
      bVar7 = 1 < lVar11;
      lVar11 = lVar11 + -1;
    } while (bVar7);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftPvec()
{

   /* the allowed tolerance is (rep() == ROW) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because thePvec is the primal VectorBase<R> in ROW and the
    * dual VectorBase<R> in COLUMN representation; this is equivalent to leavetol()
    */
   R minrandom = 10.0 * leavetol();
   R maxrandom = 100.0 * leavetol();
   R allow = leavetol() - epsilon();
   bool tmp;
   int i;

   assert(type() == LEAVE);
   assert(allow > 0.0);

   for(i = dim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(coId(i));

      if((*theCoUbound)[i] + allow <= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftUCbound(i, (*theCoPvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUCbound(i, (*theCoPvec)[i]);
            (*theCoLbound)[i] = (*theCoUbound)[i];
         }
      }
      else if((*theCoLbound)[i] - allow >= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftLCbound(i, (*theCoPvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLCbound(i, (*theCoPvec)[i]);
            (*theCoUbound)[i] = (*theCoLbound)[i];
         }
      }
   }

   for(i = coDim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(id(i));

      if((*theUbound)[i] + allow <= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftUPbound(i, (*thePvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUPbound(i, (*thePvec)[i]);
            (*theLbound)[i] = (*theUbound)[i];
         }
      }
      else if((*theLbound)[i] - allow >= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftLPbound(i, (*thePvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLPbound(i, (*thePvec)[i]);
            (*theUbound)[i] = (*theLbound)[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT02 shiftPvec: OK\n");
#endif
}